

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseUDP.cpp
# Opt level: O2

void __thiscall tonk::UDPSocket::CloseSocket(UDPSocket *this)

{
  ostringstream *this_00;
  basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_> *this_01;
  Channel *pCVar1;
  OutputWorker *this_02;
  error_code error;
  string local_1d0 [32];
  int local_1b0 [2];
  long *local_1a8;
  LogStringBuffer local_1a0;
  
  LOCK();
  (this->SocketClosed)._M_base._M_i = true;
  UNLOCK();
  this_01 = &((this->Socket)._M_t.
              super___uniq_ptr_impl<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
              .
              super__Head_base<0UL,_asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_false>
             ._M_head_impl)->
             super_basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>;
  if (this_01 != (basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_> *)0x0)
  {
    local_1b0[0] = 0;
    local_1a8 = (long *)std::_V2::system_category();
    asio::basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>::close
              (this_01,(int)local_1b0);
    if (local_1b0[0] != 0) {
      pCVar1 = (this->Deps).Logger;
      (**(code **)(*local_1a8 + 0x20))(local_1d0);
      if ((int)pCVar1->ChannelMinLevel < 4) {
        local_1a0.ChannelName = pCVar1->ChannelName;
        this_00 = &local_1a0.LogStream;
        local_1a0.LogLevel = Warning;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
        std::operator<<((ostream *)this_00,(string *)&pCVar1->Prefix);
        std::operator<<((ostream *)this_00,"Failure while destroying UDP socket: ");
        std::operator<<((ostream *)this_00,local_1d0);
        this_02 = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(this_02,&local_1a0);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
      }
      std::__cxx11::string::~string(local_1d0);
    }
  }
  return;
}

Assistant:

void UDPSocket::CloseSocket()
{
    SocketClosed = true;

    if (Socket)
    {
        asio::error_code error;
        Socket->close(error);

        if (error) {
            Deps.Logger->Warning("Failure while destroying UDP socket: ", error.message());
        }
    }
}